

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.hpp
# Opt level: O0

Vector<double,_7U> * __thiscall
OpenMD::RNEMD::SPFForceManager::linearCombination<OpenMD::Vector<double,7u>>
          (SPFForceManager *this,Vector<double,_7U> *quantityA,Vector<double,_7U> *quantityB)

{
  Vector<double,_7U> *in_RCX;
  Vector<double,_7U> *in_RDX;
  SPFForceManager *in_RDI;
  RealType result;
  Snapshot *in_stack_ffffffffffffff08;
  SPFForceManager *this_00;
  
  this_00 = in_RDI;
  Snapshot::getSPFData(in_stack_ffffffffffffff08);
  std::__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x4084be);
  f_lambda(this_00,(RealType)in_RDX);
  std::shared_ptr<OpenMD::SPFData>::~shared_ptr((shared_ptr<OpenMD::SPFData> *)0x4084e2);
  OpenMD::operator*((double)in_RDX,in_RCX);
  OpenMD::operator*((double)in_RDX,in_RCX);
  OpenMD::operator+(in_RDX,in_RCX);
  return (Vector<double,_7U> *)in_RDI;
}

Assistant:

T linearCombination(T quantityA, T quantityB) {
      RealType result = f_lambda(currentSnapshot_->getSPFData()->lambda);

      return T {(1.0 - result) * quantityA + result * quantityB};
    }